

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O1

bool embree::os_init(bool hugepages,bool verbose)

{
  char *__nptr;
  char cVar1;
  int iVar2;
  istream *piVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  undefined7 in_register_00000039;
  bool bVar7;
  string line;
  string unit;
  string val;
  Lock<embree::MutexSys> lock;
  string tag;
  stringstream sline;
  ifstream file;
  undefined1 *local_460;
  undefined8 local_458;
  undefined1 local_450 [16];
  ulong local_440;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428 [16];
  char *local_418;
  undefined8 local_410;
  char local_408 [16];
  Lock<embree::MutexSys> local_3f8;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8 [16];
  char *local_3c8;
  long local_3c0 [4];
  byte abStack_3a0 [96];
  ios_base local_340 [264];
  long local_238 [65];
  
  local_3f8.mutex = (MutexSys *)&os_init_mutex;
  local_3f8.locked = true;
  MutexSys::lock((MutexSys *)&os_init_mutex);
  if ((int)CONCAT71(in_register_00000039,hugepages) == 0) {
    huge_pages_enabled = 0;
    bVar7 = true;
  }
  else {
    std::ifstream::ifstream(local_238);
    std::ifstream::open((char *)local_238,0x254f13);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "WARNING: Could not open /proc/meminfo. Huge page support cannot get enabled!",
                   0x4c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      huge_pages_enabled = 0;
      bVar7 = false;
    }
    else {
      local_460 = local_450;
      local_458 = 0;
      local_450[0] = 0;
      local_440 = 0;
      do {
        cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_460,cVar1);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_3c0,(string *)&local_460,_S_out|_S_in);
        while ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 2) == 0) {
          iVar2 = std::istream::peek();
          if (iVar2 != 0x20) break;
          std::istream::ignore();
        }
        local_3e0 = 0;
        local_3d8[0] = 0;
        local_3e8 = local_3d8;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_3e8,' ');
        while ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 2) == 0) {
          iVar2 = std::istream::peek();
          if (iVar2 != 0x20) break;
          std::istream::ignore();
        }
        local_418 = local_408;
        local_410 = 0;
        local_408[0] = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_418,' ');
        while ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 2) == 0) {
          iVar2 = std::istream::peek();
          if (iVar2 != 0x20) break;
          std::istream::ignore();
        }
        local_438 = local_428;
        local_430 = 0;
        local_428[0] = 0;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_438,' ');
        iVar2 = std::__cxx11::string::compare((char *)&local_3e8);
        bVar7 = true;
        if (iVar2 == 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_438);
          __nptr = local_418;
          if (iVar2 == 0) {
            piVar4 = __errno_location();
            iVar2 = *piVar4;
            *piVar4 = 0;
            lVar5 = strtol(__nptr,&local_3c8,10);
            if (local_3c8 == __nptr) {
              std::__throw_invalid_argument("stoi");
LAB_001d883c:
              uVar6 = std::__throw_out_of_range("stoi");
              if (local_460 != local_450) {
                operator_delete(local_460);
              }
              std::ifstream::~ifstream(local_238);
              Lock<embree::MutexSys>::~Lock(&local_3f8);
              _Unwind_Resume(uVar6);
            }
            if (((int)lVar5 != lVar5) || (*piVar4 == 0x22)) goto LAB_001d883c;
            if (*piVar4 == 0) {
              *piVar4 = iVar2;
            }
            local_440 = (ulong)(uint)((int)lVar5 << 10);
            bVar7 = false;
          }
        }
        if (local_438 != local_428) {
          operator_delete(local_438);
        }
        if (local_418 != local_408) {
          operator_delete(local_418);
        }
        if (local_3e8 != local_3d8) {
          operator_delete(local_3e8);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
        std::ios_base::~ios_base(local_340);
      } while (bVar7);
      iVar2 = (int)local_440;
      bVar7 = iVar2 == 0x200000;
      if (verbose && !bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "WARNING: Only 2MB huge pages supported. Huge page support cannot get enabled!",
                   0x4d);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      huge_pages_enabled = iVar2 == 0x200000;
      if (local_460 != local_450) {
        operator_delete(local_460);
      }
    }
    std::ifstream::~ifstream(local_238);
  }
  if (local_3f8.locked == true) {
    MutexSys::unlock(local_3f8.mutex);
  }
  return bVar7;
}

Assistant:

bool os_init(bool hugepages, bool verbose) 
  {
    Lock<MutexSys> lock(os_init_mutex);

    if (!hugepages) {
      huge_pages_enabled = false;
      return true;
    }

#if defined(__LINUX__)

    int hugepagesize = 0;

    std::ifstream file; 
    file.open("/proc/meminfo",std::ios::in);
    if (!file.is_open()) {
      if (verbose) std::cout << "WARNING: Could not open /proc/meminfo. Huge page support cannot get enabled!" << std::endl;
      huge_pages_enabled = false;
      return false;
    }
    
    std::string line;
    while (getline(file,line))
    {
      std::stringstream sline(line);
      while (!sline.eof() && sline.peek() == ' ') sline.ignore();
      std::string tag; getline(sline,tag,' ');
      while (!sline.eof() && sline.peek() == ' ') sline.ignore();
      std::string val; getline(sline,val,' ');
      while (!sline.eof() && sline.peek() == ' ') sline.ignore();
      std::string unit; getline(sline,unit,' ');
      if (tag == "Hugepagesize:" && unit == "kB") {
	hugepagesize = std::stoi(val)*1024;
	break;
      }
    }
    
    if (hugepagesize != PAGE_SIZE_2M) 
    {
      if (verbose) std::cout << "WARNING: Only 2MB huge pages supported. Huge page support cannot get enabled!" << std::endl;
      huge_pages_enabled = false;
      return false;
    }
#endif

    huge_pages_enabled = true;
    return true;
  }